

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t pax_attribute_read_number(archive_read *a,size_t value_length,int64_t *result)

{
  int64_t iVar1;
  size_t sStack_48;
  wchar_t r;
  size_t unconsumed;
  archive_string as;
  int64_t *result_local;
  size_t value_length_local;
  archive_read *a_local;
  
  sStack_48 = 0;
  as.buffer_length = (size_t)result;
  if (value_length < 0x41) {
    unconsumed = 0;
    as.s = (char *)0x0;
    as.length = 0;
    a_local._4_4_ =
         read_bytes_to_string(a,(archive_string *)&unconsumed,value_length,&stack0xffffffffffffffb8)
    ;
    tar_flush_unconsumed(a,&stack0xffffffffffffffb8);
    if (a_local._4_4_ < L'\0') {
      archive_string_free((archive_string *)&unconsumed);
    }
    else {
      iVar1 = tar_atol10((char *)unconsumed,(size_t)as.s);
      *(int64_t *)as.buffer_length = iVar1;
      archive_string_free((archive_string *)&unconsumed);
      if ((*(long *)as.buffer_length < 0) || (*(long *)as.buffer_length == 0x7fffffffffffffff)) {
        *(undefined8 *)as.buffer_length = 0x7fffffffffffffff;
        a_local._4_4_ = L'\xffffffec';
      }
      else {
        a_local._4_4_ = L'\0';
      }
    }
  }
  else {
    __archive_read_consume(a,value_length);
    *(undefined8 *)as.buffer_length = 0;
    a_local._4_4_ = L'\xffffffe2';
  }
  return a_local._4_4_;
}

Assistant:

static int
pax_attribute_read_number(struct archive_read *a, size_t value_length, int64_t *result) {
	struct archive_string as;
	size_t unconsumed = 0;
	int r;

	if (value_length > 64) {
		__archive_read_consume(a, value_length);
		*result = 0;
		return (ARCHIVE_FATAL);
	}

	archive_string_init(&as);
	r = read_bytes_to_string(a, &as, value_length, &unconsumed);
	tar_flush_unconsumed(a, &unconsumed);
	if (r < ARCHIVE_OK) {
		archive_string_free(&as);
		return (r);
	}

	*result = tar_atol10(as.s, archive_strlen(&as));
	archive_string_free(&as);
	if (*result < 0 || *result == INT64_MAX) {
		*result = INT64_MAX;
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
}